

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O1

pair<std::vector<char16_t,_std::allocator<char16_t>_>,_std::vector<char16_t,_std::allocator<char16_t>_>_>
* __thiscall
jessilib::
split_once<std::vector<char16_t,std::allocator<char16_t>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,char16_t>
          (pair<std::vector<char16_t,_std::allocator<char16_t>_>,_std::vector<char16_t,_std::allocator<char16_t>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
          begin,__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                end,char16_t in_delim)

{
  pointer pcVar1;
  pointer pcVar2;
  __normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_> __last;
  allocator_type local_69;
  pointer local_68;
  pointer pcStack_60;
  pointer pcStack_58;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  pointer pcStack_30;
  pointer local_28;
  pointer pcStack_20;
  
  local_28 = (pointer)0x0;
  pcStack_20 = (pointer)0x0;
  local_38 = (pointer)0x0;
  pcStack_30 = (pointer)0x0;
  local_48 = (pointer)0x0;
  pcStack_40 = (pointer)0x0;
  __last._M_current = (char16_t *)this;
  if (this < begin._M_current) {
    do {
      if (*__last._M_current == (char16_t)end._M_current) {
        std::vector<char16_t,std::allocator<char16_t>>::
        vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                  ((vector<char16_t,std::allocator<char16_t>> *)&local_68,
                   (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                    )this,__last,&local_69);
        pcVar1 = local_38;
        pcVar2 = local_48;
        local_48 = local_68;
        pcStack_40 = pcStack_60;
        local_38 = pcStack_58;
        local_68 = (pointer)0x0;
        pcStack_60 = (pointer)0x0;
        pcStack_58 = (pointer)0x0;
        if (pcVar2 != (pointer)0x0) {
          operator_delete(pcVar2,(long)pcVar1 - (long)pcVar2);
        }
        if (local_68 != (pointer)0x0) {
          operator_delete(local_68,(long)pcStack_58 - (long)local_68);
        }
        std::vector<char16_t,std::allocator<char16_t>>::
        vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
                  ((vector<char16_t,std::allocator<char16_t>> *)&local_68,
                   (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                    )(__last._M_current + 1),begin,&local_69);
        pcVar1 = pcStack_20;
        pcVar2 = pcStack_30;
        pcStack_30 = local_68;
        local_28 = pcStack_60;
        pcStack_20 = pcStack_58;
        goto LAB_00333777;
      }
      __last._M_current = __last._M_current + 1;
    } while (__last._M_current != begin._M_current);
    std::vector<char16_t,std::allocator<char16_t>>::
    vector<__gnu_cxx::__normal_iterator<char16_t_const*,std::vector<char16_t,std::allocator<char16_t>>>,void>
              ((vector<char16_t,std::allocator<char16_t>> *)&local_68,
               (__normal_iterator<const_char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                )this,begin,&local_69);
    pcVar1 = local_38;
    pcVar2 = local_48;
    local_48 = local_68;
    pcStack_40 = pcStack_60;
    local_38 = pcStack_58;
LAB_00333777:
    local_68 = (pointer)0x0;
    pcStack_60 = (pointer)0x0;
    pcStack_58 = (pointer)0x0;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2,(long)pcVar1 - (long)pcVar2);
    }
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68,(long)pcStack_58 - (long)local_68);
    }
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_finish = pcStack_40;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
  }
  else {
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->first).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
  super__Vector_impl_data._M_start = pcStack_30;
  (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
  super__Vector_impl_data._M_finish = local_28;
  (__return_storage_ptr__->second).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcStack_20;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}